

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryContextTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GetCurrentContextCase::executeForContext
          (GetCurrentContextCase *this,EGLDisplay display,EGLContext context,EGLSurface surface,
          Config *config)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  deUint32 err;
  Library *pLVar2;
  EGLContext pvVar3;
  char *description;
  TestContext *this_01;
  Hex<16UL> local_1b0;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  pLVar2 = EglTestContext::getLibrary
                     ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                      super_TestCase.m_eglTestCtx);
  pTVar1 = ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
            super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  (this->super_CallLogWrapper).m_enableLog = true;
  pvVar3 = eglu::CallLogWrapper::eglGetCurrentContext(&this->super_CallLogWrapper);
  err = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
  eglu::checkError(err,"eglGetCurrentContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQueryContextTests.cpp"
                   ,0x6b);
  this_00 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar1;
  if (pvVar3 == context) {
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"  Pass",6);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
  }
  else {
    if (pvVar3 == (EGLContext)0x0) {
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"  Fail, got EGL_NO_CONTEXT",0x1a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_130);
      this_01 = (this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      description = "Unexpected EGL_NO_CONTEXT";
    }
    else {
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"  Fail, call returned the wrong context. Expected: ",0x33);
      local_1b0.value = (deUint64)context;
      tcu::Format::Hex<16UL>::toStream(&local_1b0,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", got: ",7);
      local_1b0.value = (deUint64)pvVar3;
      tcu::Format::Hex<16UL>::toStream(&local_1b0,(ostream *)this_00);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_130);
      this_01 = (this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      description = "Invalid context";
    }
    tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,description);
  }
  (this->super_CallLogWrapper).m_enableLog = false;
  return;
}

Assistant:

void executeForContext (EGLDisplay display, EGLContext context, EGLSurface surface, const Config& config)
	{
		const Library&	egl	= m_eglTestCtx.getLibrary();
		TestLog&		log	= m_testCtx.getLog();

		DE_UNREF(display);
		DE_UNREF(surface);
		DE_UNREF(config);

		enableLogging(true);

		const EGLContext	gotContext	= eglGetCurrentContext();
		EGLU_CHECK_MSG(egl, "eglGetCurrentContext");

		if (gotContext == context)
		{
			log << TestLog::Message << "  Pass" << TestLog::EndMessage;
		}
		else if (gotContext == EGL_NO_CONTEXT)
		{
			log << TestLog::Message << "  Fail, got EGL_NO_CONTEXT" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected EGL_NO_CONTEXT");
		}
		else if (gotContext != context)
		{
			log << TestLog::Message << "  Fail, call returned the wrong context. Expected: " << tcu::toHex(context) << ", got: " << tcu::toHex(gotContext) << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid context");
		}

		enableLogging(false);
	}